

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTPNArglist * __thiscall CTcPrsOpBinGroupCompare::parse_inlist(CTcPrsOpBinGroupCompare *this)

{
  undefined1 *puVar1;
  CTPNArg *pCVar2;
  tc_toktyp_t tVar3;
  CTcPrsNode *pCVar4;
  CTPNArg *pCVar5;
  ulong uVar6;
  CTPNArglist *pCVar7;
  CTPNArg *pCVar8;
  int iVar9;
  size_t in_RSI;
  CTPNArg *pCVar10;
  
  tVar3 = CTcTokenizer::next(G_tok);
  if (tVar3 == TOKT_LPAR) {
    CTcTokenizer::next(G_tok);
  }
  else {
    in_RSI = 0x2ba3;
    CTcTokenizer::log_error_curtok(G_tok,0x2ba3);
  }
  pCVar8 = (CTPNArg *)0x0;
  iVar9 = 0;
  pCVar10 = (CTPNArg *)0x0;
  do {
    if ((G_tok->curtok_).typ_ == TOKT_RPAR) {
LAB_001fa6eb:
      CTcTokenizer::next(G_tok);
LAB_001fa6f0:
      pCVar7 = (CTPNArglist *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,in_RSI);
      (pCVar7->super_CTPNArglistBase).argc_ = iVar9;
      (pCVar7->super_CTPNArglistBase).list_ = pCVar8;
      (pCVar7->super_CTPNArglistBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)&PTR_gen_code_0030b180;
      return pCVar7;
    }
    pCVar4 = CTcPrsOpAsi::parse(&S_op_asi);
    if (pCVar4 == (CTcPrsNode *)0x0) {
      return (CTPNArglist *)0x0;
    }
    pCVar5 = (CTPNArg *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x48,in_RSI);
    (pCVar5->super_CTPNArgBase).arg_expr_ = pCVar4;
    (pCVar5->super_CTPNArgBase).next_arg_ = (CTPNArg *)0x0;
    puVar1 = &(pCVar5->super_CTPNArgBase).field_0x40;
    *puVar1 = *puVar1 & 0xfe;
    (pCVar5->super_CTPNArgBase).name_.typ_ = TOKT_INVALID;
    (pCVar5->super_CTPNArgBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_00311fb8;
    pCVar2 = pCVar5;
    if (pCVar10 != (CTPNArg *)0x0) {
      (pCVar10->super_CTPNArgBase).next_arg_ = pCVar5;
      pCVar2 = pCVar8;
    }
    pCVar8 = pCVar2;
    uVar6 = (ulong)(G_tok->curtok_).typ_;
    if (uVar6 < 0x2b) {
      if (uVar6 != 0x15) {
        if ((0x40001830000U >> (uVar6 & 0x3f) & 1) != 0) {
          in_RSI = 0x2ba5;
          CTcTokenizer::log_error_curtok(G_tok,0x2ba5);
          goto LAB_001fa6dc;
        }
        if (uVar6 != 0x14) goto LAB_001fa6af;
        iVar9 = iVar9 + 1;
        goto LAB_001fa6eb;
      }
      CTcTokenizer::next(G_tok);
    }
    else {
LAB_001fa6af:
      in_RSI = 0x2ba4;
      CTcTokenizer::log_error_curtok(G_tok,0x2ba4);
      if ((G_tok->curtok_).typ_ == TOKT_EOF) {
LAB_001fa6dc:
        iVar9 = iVar9 + 1;
        goto LAB_001fa6f0;
      }
    }
    iVar9 = iVar9 + 1;
    pCVar10 = pCVar5;
  } while( true );
}

Assistant:

CTPNArglist *CTcPrsOpBinGroupCompare::parse_inlist() const
{
    int argc;
    CTPNArg *arg_head;
    CTPNArg *arg_tail;

    /* skip the second keyword token, and check for an open paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip the paren */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, and keep going on the assumption that it was
         *   merely omitted and the rest of the list is well-formed 
         */
        G_tok->log_error_curtok(TCERR_IN_REQ_LPAR);
    }

    /* keep going until we find the close paren */
    for (argc = 0, arg_head = arg_tail = 0 ;; )
    {
        CTcPrsNode *expr;
        CTPNArg *arg_cur;

        /* if this is the close paren, we're done */
        if (G_tok->cur() == TOKT_RPAR)
            break;

        /* parse this expression */
        expr = S_op_asi.parse();
        if (expr == 0)
            return 0;

        /* count the argument */
        ++argc;

        /* create a new argument node */
        arg_cur = new CTPNArg(expr);

        /* 
         *   link the new node at the end of our list (this preserves the
         *   order of the original list) 
         */
        if (arg_tail != 0)
            arg_tail->set_next_arg(arg_cur);
        else
            arg_head = arg_cur;
        arg_tail = arg_cur;

        /* we need to be looking at a comma or right paren */
        if (G_tok->cur() == TOKT_RPAR)
        {
            /* that's the end of the list */
            break;
        }
        else if (G_tok->cur() == TOKT_COMMA)
        {
            /* skip the comma and parse the next argument */
            G_tok->next();
        }
        else
        {
            /* 
             *   If we're at the end of the file, there's no point
             *   proceding, so return failure.  If we've reached something
             *   that looks like a statement separator (semicolon, curly
             *   brace), also return failure, since the problem is clearly
             *   a missing right paren.  Otherwise, assume that a comma
             *   was missing and continue as though we have another
             *   argument.  
             */
            switch(G_tok->cur())
            {
            default:
                /* log an error */
                G_tok->log_error_curtok(TCERR_EXPECTED_IN_COMMA);

                /* 
                 *   if we're at the end of file, return what we have so
                 *   far; otherwise continue, assuming that they merely
                 *   left out a comma between two argument expressions 
                 */
                if (G_tok->cur() == TOKT_EOF)
                    return new CTPNArglist(argc, arg_head);
                break;

            case TOKT_SEM:
            case TOKT_LBRACE:
            case TOKT_RBRACE:
            case TOKT_DSTR_MID:
            case TOKT_DSTR_END:
                /* 
                 *   we're apparently at the end of the statement; flag
                 *   the error as a missing right paren, and return what
                 *   we have so far 
                 */
                G_tok->log_error_curtok(TCERR_EXPECTED_IN_RPAR);
                return new CTPNArglist(argc, arg_head);
            }
        }
    }

    /* skip the closing paren */
    G_tok->next();

    /* create and return the argument list descriptor */
    return new CTPNArglist(argc, arg_head);
}